

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O2

void * TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
       ::ElementAssemble(void *t)

{
  long lVar1;
  long object;
  TPZCompEl *pTVar2;
  TPZGuiInterface *this;
  bool bVar3;
  TPZCompEl **ppTVar4;
  TPZElementMatrixT<std::complex<double>_> *this_00;
  TPZElementMatrixT<std::complex<double>_> *this_01;
  ostream *poVar5;
  long nelem;
  unique_lock<std::mutex> assemble_lock;
  
  lVar1 = *(long *)((long)t + 8);
  do {
    if (*(long *)((long)t + 0xe8) <= *(long *)((long)t + 0xd8)) {
LAB_011d361a:
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "static void *TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>>, std::complex<double>>::ElementAssemble(void *) [TFront = TPZFrontSym<std::complex<double>>, TVar = std::complex<double>, TPar = TPZStructMatrixOR<CSTATE>]"
                              );
      std::operator<<(poVar5," Falling through \n");
      return (void *)0x0;
    }
    std::unique_lock<std::mutex>::unique_lock(&assemble_lock,&mutex_element_assemble);
    if (*(long *)((long)t + 0x118) == (long)*(int *)((long)t + 0xf0)) {
      std::condition_variable::wait((unique_lock *)stackfull);
    }
    object = *(long *)((long)t + 0xd8);
    if (object == *(long *)((long)t + 0xe8)) {
      std::unique_lock<std::mutex>::unlock(&assemble_lock);
      std::unique_lock<std::mutex>::~unique_lock(&assemble_lock);
      return (void *)0x0;
    }
    *(long *)((long)t + 0xd8) = object + 1;
    std::unique_lock<std::mutex>::unlock(&assemble_lock);
    nelem = (long)*(int *)(*(long *)((long)t + 0xb0) + object * 4);
    if (-1 < nelem) {
      ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          ((TPZChunkVector<TPZCompEl_*,_10> *)(lVar1 + 0x40),nelem);
      pTVar2 = *ppTVar4;
      if (pTVar2 != (TPZCompEl *)0x0) {
        this_00 = (TPZElementMatrixT<std::complex<double>_> *)operator_new(0x81d0);
        TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
                  (this_00,*(TPZCompMesh **)((long)t + 8),EK);
        this_01 = (TPZElementMatrixT<std::complex<double>_> *)operator_new(0x81d0);
        TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
                  (this_01,*(TPZCompMesh **)((long)t + 8),EF);
        (**(code **)(*(long *)pTVar2 + 0x110))(pTVar2,this_00,this_01);
        std::mutex::lock(&mutex_global_assemble);
        TPZStack<long,_10>::Push((TPZStack<long,_10> *)((long)t + 0x108),object);
        TPZStack<TPZElementMatrix_*,_10>::Push
                  ((TPZStack<TPZElementMatrix_*,_10> *)((long)t + 0x178),(TPZElementMatrix *)this_00
                  );
        TPZStack<TPZElementMatrix_*,_10>::Push
                  ((TPZStack<TPZElementMatrix_*,_10> *)((long)t + 0x1e8),(TPZElementMatrix *)this_01
                  );
        std::condition_variable::notify_all();
        pthread_mutex_unlock((pthread_mutex_t *)&mutex_global_assemble);
        if (((*(undefined8 **)((long)t + 0xd0) != (undefined8 *)0x0) &&
            (this = (TPZGuiInterface *)**(undefined8 **)((long)t + 0xd0),
            this != (TPZGuiInterface *)0x0)) && (bVar3 = TPZGuiInterface::AmIKilled(this), bVar3)) {
          std::unique_lock<std::mutex>::~unique_lock(&assemble_lock);
          goto LAB_011d361a;
        }
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&assemble_lock);
  } while( true );
}

Assistant:

void *TPZParFrontStructMatrix<TFront,TVar,TPar>::ElementAssemble(void *t){
    
    
	TPZParFrontStructMatrix<TFront,TVar,TPar> *parfront = (TPZParFrontStructMatrix<TFront,TVar,TPar> *) t;
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = parfront->fMesh->ElementVec();
	
	
	while(parfront->fCurrentElement < parfront->fNElements) {
		
		/**
		 *Lock mutex and search for an avilable element
		 *A global variable to be updated whenever a element is processed
		 */
		
		//Lock a mutex and get an element number
        std::unique_lock<std::mutex> assemble_lock(mutex_element_assemble);
//        assemble_lock.lock();

		//Stack is full and process must wait here!
		if(parfront->felnum.NElements()==parfront->fMaxStackSize)
        {
			/*          cout << "    Stack full" << endl;
			 cout << "    Waiting" << endl;
			 cout.flush();*/
			//cout << "Mutex unlocked on Condwait" << endl;
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "Entering cond_wait because of stack overflow ";
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
            stackfull.wait(assemble_lock);
			//cout << "Mutex LOCKED leaving Condwait" << endl;
			
        }
		
		//cout << "Locking mutex_element_assemble" << endl;
		//cout.flush();
		int64_t local_element = parfront->fCurrentElement;
		if(local_element==parfront->fNElements)
        {
            assemble_lock.unlock();
            return 0;
        }
		/*          cout << "All element matrices assembled" << endl;
		 return 0;
		 }
		 */
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Computing element " << local_element;
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		parfront->fCurrentElement++;
		//Unlock mutex and / or send a broadcast
		//cout << "Computing Element " << parfront->fCurrentElement << endl;
		//cout << "Unlocking mutex_element_assemble" << endl;
		//cout.flush();
        assemble_lock.unlock();

		
		if(parfront->fElementOrder[local_element] < 0) continue;
		TPZCompEl *el = elementvec[parfront->fElementOrder[local_element]];
		if(!el) continue;
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		auto *ek =
            new TPZElementMatrixT<TVar>(parfront->fMesh,TPZElementMatrix::EK);
		auto *ef =
            new TPZElementMatrixT<TVar>(parfront->fMesh,TPZElementMatrix::EF);
		
		el->CalcStiff(*ek, *ef);
		//Locks a mutex and adds element contribution to frontmatrix
		//if mutex is locked go to condwait waiting for an specific condvariable
		// este mutex deve ser outro mutex -> mutexassemble
        {
            std::lock_guard<std::mutex> global_ass(mutex_global_assemble);
            //cout << "Locking mutex_global_assemble" << endl;
            //cout << "Pushing variables to the stack" << endl;
            //cout.flush();
            
            // colocar ek, ef e o element_local no stack
            parfront->felnum.Push(local_element);
            parfront->fekstack.Push(ek);
            parfront->fefstack.Push(ef);
            
    #ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Pushing element " << local_element << " on the stack, stack sizes " << parfront->felnum.NElements() << " " << parfront->fekstack.NElements() << " " << parfront->fefstack.NElements();
                LOGPZ_DEBUG(logger,sout.str())
            }
    #endif
            // Outro thread procura se stack contem o proximo elemento
            // qdo nao encontra entra em condwait de acordo com condassemble
            // isso ocorre num outro processo
            // Uma vez que uma nova ek foi adicionada ao stack
            // chame broadcast para acordar o thread que faz assemblagem global
            
            //cout << "Unlocking mutex_global_assemble" << endl;
            //cout << "Broadcasting condassemble" << endl;
            //cout.flush();
            
            /*     if(!(parfront->fCurrentElement%20)){
             cout << endl << "Computing " << parfront->fCurrentElement << " on thread " << std::this_thread::get_id() << endl;
             cout << " " << (100*parfront->fCurrentElement/parfront->fNElements) << "% Elements computed" << "     " << (100*parfront->fCurrentAssembled/parfront->fNElements) << "% Elements assembled" << endl;
             }
             cout << '*';
             cout.flush();
             */
            //Alterado cond_broadcast para cond_signal
            //invertendo a sequencia das chamadas
            condassemble.notify_all();
        }
		// o thread de assemblagem utiliza mutexassemble
		// e feito em outro thread     AssembleElement(el, ek, ef, stiffness, rhs);
		
		if(parfront->fGuiInterface) if(parfront->fGuiInterface->AmIKilled()){
			break;
		}
	}//fim for iel
	
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " Falling through";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	std::cout << __PRETTY_FUNCTION__ << " Falling through \n";
    
	return NULL;
	
}